

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUpdateHandler.cxx
# Opt level: O1

int __thiscall cmCTestUpdateHandler::ProcessHandler(cmCTestUpdateHandler *this)

{
  string *content;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  int iVar3;
  cmCTest *pcVar4;
  double dVar5;
  char cVar6;
  bool bVar7;
  char *__s;
  size_t sVar8;
  cmCTestP4 *this_00;
  long *plVar9;
  undefined8 *puVar10;
  ostream *poVar11;
  size_type *psVar12;
  ulong *puVar13;
  char *__s_00;
  int iVar14;
  undefined8 uVar15;
  int iVar16;
  string end_time;
  cmXMLWriter xml;
  uint start_time_time;
  ostringstream cmCTestLog_msg_3;
  string buildname;
  string start_time;
  cmGeneratedFileStream os;
  cmCLocaleEnvironmentScope fixLocale;
  cmGeneratedFileStream ofs;
  undefined1 auStack_7a8 [8];
  cmCTestP4 *local_7a0;
  string local_798;
  char local_772;
  char local_771;
  string local_770;
  undefined1 local_750 [84];
  uint uStack_6fc;
  undefined1 local_6f8 [112];
  ios_base local_688 [264];
  string local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_560;
  double local_558;
  string local_550;
  string local_530;
  string local_510;
  undefined1 local_4f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e0 [6];
  ios_base local_480 [472];
  cmCLocaleEnvironmentScope local_2a8;
  undefined1 local_278 [112];
  ios_base local_208 [472];
  
  cmCLocaleEnvironmentScope::cmCLocaleEnvironmentScope(&local_2a8);
  local_278._0_8_ = local_278 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"SourceDirectory","");
  __s = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_278);
  if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  if (__s == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"Cannot find SourceDirectory  key in the DartConfiguration.tcl",
               0x3d);
    std::ios::widen((char)(ostream *)local_278 + (char)*(undefined8 *)(local_278._0_8_ + -0x18));
    std::ostream::put((char)local_278);
    std::ostream::flush();
    pcVar4 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar4,6,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                 ,0x71,(char *)local_4f0._0_8_,false);
    if ((undefined1 *)local_4f0._0_8_ != local_4f0 + 0x10) {
      operator_delete((void *)local_4f0._0_8_,local_4e0[0]._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
    std::ios_base::~ios_base(local_208);
    iVar16 = -1;
    goto LAB_002fe6cd;
  }
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_278,None);
  bVar7 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
  if (!bVar7) {
    cmCTestGenericHandler::StartLogFile
              (&this->super_cmCTestGenericHandler,"Update",(cmGeneratedFileStream *)local_278);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_4f0,"   Updating the repository: ",0x1c);
  sVar8 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f0,__s,sVar8);
  std::ios::widen((char)(ostream *)local_4f0 + (char)*(_func_int **)(local_4f0._0_8_ + -0x18));
  std::ostream::put((char)local_4f0);
  std::ostream::flush();
  pcVar4 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar4,2,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
               ,0x7d,(char *)local_6f8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
  pcVar2 = local_6f8 + 0x10;
  if ((char *)local_6f8._0_8_ != pcVar2) {
    operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f0);
  std::ios_base::~ios_base(local_480);
  bVar7 = SelectVCS(this);
  iVar16 = -1;
  if (bVar7) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f0,"   Use ",7);
    if ((ulong)(uint)this->UpdateType < 7) {
      __s_00 = cmCTestUpdateHandlerUpdateStrings[(uint)this->UpdateType];
    }
    else {
      __s_00 = "Unknown";
    }
    if (__s_00 == (char *)0x0) {
      std::ios::clear((int)(auStack_7a8 + (long)*(_func_int **)(local_4f0._0_8_ + -0x18)) + 0x2b8);
    }
    else {
      sVar8 = strlen(__s_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f0,__s_00,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f0," repository type",0x10)
    ;
    std::ios::widen((char)(ostream *)local_4f0 + (char)*(_func_int **)(local_4f0._0_8_ + -0x18));
    std::ostream::put((char)local_4f0);
    std::ostream::flush();
    pcVar4 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar4,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                 ,0x86,(char *)local_6f8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
    if ((char *)local_6f8._0_8_ != pcVar2) {
      operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f0);
    std::ios_base::~ios_base(local_480);
    switch(this->UpdateType) {
    case 1:
      this_00 = (cmCTestP4 *)operator_new(0x1b8);
      cmCTestCVS::cmCTestCVS
                ((cmCTestCVS *)this_00,(this->super_cmCTestGenericHandler).CTest,
                 (ostream *)local_278);
      break;
    case 2:
      this_00 = (cmCTestP4 *)operator_new(0x330);
      cmCTestSVN::cmCTestSVN
                ((cmCTestSVN *)this_00,(this->super_cmCTestGenericHandler).CTest,
                 (ostream *)local_278);
      break;
    case 3:
      this_00 = (cmCTestP4 *)operator_new(0x330);
      cmCTestBZR::cmCTestBZR
                ((cmCTestBZR *)this_00,(this->super_cmCTestGenericHandler).CTest,
                 (ostream *)local_278);
      break;
    case 4:
      this_00 = (cmCTestP4 *)operator_new(0x318);
      cmCTestGIT::cmCTestGIT
                ((cmCTestGIT *)this_00,(this->super_cmCTestGenericHandler).CTest,
                 (ostream *)local_278);
      break;
    case 5:
      this_00 = (cmCTestP4 *)operator_new(0x310);
      cmCTestHG::cmCTestHG
                ((cmCTestHG *)this_00,(this->super_cmCTestGenericHandler).CTest,(ostream *)local_278
                );
      break;
    case 6:
      this_00 = (cmCTestP4 *)operator_new(0x370);
      cmCTestP4::cmCTestP4(this_00,(this->super_cmCTestGenericHandler).CTest,(ostream *)local_278);
      break;
    default:
      this_00 = (cmCTestP4 *)operator_new(0x188);
      cmCTestVC::cmCTestVC
                ((cmCTestVC *)this_00,(this->super_cmCTestGenericHandler).CTest,(ostream *)local_278
                );
    }
    cmCTestVC::SetCommandLineTool((cmCTestVC *)this_00,&this->UpdateCommand);
    local_4f0._0_8_ = local_4f0 + 0x10;
    sVar8 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4f0,__s,__s + sVar8);
    cmCTestVC::SetSourceDirectory((cmCTestVC *)this_00,(string *)local_4f0);
    if ((undefined1 *)local_4f0._0_8_ != local_4f0 + 0x10) {
      operator_delete((void *)local_4f0._0_8_,local_4e0[0]._M_allocated_capacity + 1);
    }
    cmCTestVC::Cleanup((cmCTestVC *)this_00);
    cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_4f0,None);
    bVar7 = cmCTestGenericHandler::StartResultingXML
                      (&this->super_cmCTestGenericHandler,PartUpdate,"Update",
                       (cmGeneratedFileStream *)local_4f0);
    if (bVar7) {
      local_7a0 = this_00;
      cmCTest::CurrentTime_abi_cxx11_(&local_510,(this->super_cmCTestGenericHandler).CTest);
      dVar5 = cmsys::SystemTools::GetTime();
      uStack_6fc = (uint)(long)dVar5;
      local_558 = cmsys::SystemTools::GetTime();
      bVar7 = cmCTestVC::Update((cmCTestVC *)this_00);
      pcVar4 = (this->super_cmCTestGenericHandler).CTest;
      local_750._0_8_ = local_750 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_750,"BuildName","");
      cmCTest::GetCTestConfiguration((string *)local_6f8,pcVar4,(string *)local_750);
      cmCTest::SafeBuildIdField(&local_530,(string *)local_6f8);
      if ((char *)local_6f8._0_8_ != pcVar2) {
        operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
      }
      if ((undefined1 *)local_750._0_8_ != local_750 + 0x10) {
        operator_delete((void *)local_750._0_8_,local_750._16_8_ + 1);
      }
      cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_750,(ostream *)local_4f0,0);
      cmXMLWriter::StartDocument((cmXMLWriter *)local_750,"UTF-8");
      local_6f8._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"Update","");
      cmXMLWriter::StartElement((cmXMLWriter *)local_750,(string *)local_6f8);
      if ((char *)local_6f8._0_8_ != pcVar2) {
        operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
      }
      cmXMLWriter::Attribute<char[7]>((cmXMLWriter *)local_750,"mode",(char (*) [7])0x636cbf);
      paVar1 = &local_798.field_2;
      local_798._M_dataplus._M_p = (pointer)paVar1;
      local_771 = bVar7;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_798,"ctest-","");
      cmVersion::GetCMakeVersion();
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_798);
      psVar12 = (size_type *)(plVar9 + 2);
      if ((size_type *)*plVar9 == psVar12) {
        local_6f8._16_8_ = *psVar12;
        local_6f8._24_8_ = plVar9[3];
        local_6f8._0_8_ = pcVar2;
      }
      else {
        local_6f8._16_8_ = *psVar12;
        local_6f8._0_8_ = (size_type *)*plVar9;
      }
      local_6f8._8_8_ = plVar9[1];
      *plVar9 = (long)psVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      cmXMLWriter::Attribute<std::__cxx11::string>
                ((cmXMLWriter *)local_750,"Generator",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6f8);
      if ((char *)local_6f8._0_8_ != pcVar2) {
        operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_798._M_dataplus._M_p != paVar1) {
        operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
      }
      local_6f8._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"Site","");
      pcVar4 = (this->super_cmCTestGenericHandler).CTest;
      local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_770,"Site","");
      cmCTest::GetCTestConfiguration(&local_798,pcVar4,&local_770);
      cmXMLWriter::StartElement((cmXMLWriter *)local_750,(string *)local_6f8);
      cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_750,&local_798);
      cmXMLWriter::EndElement((cmXMLWriter *)local_750);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_798._M_dataplus._M_p != paVar1) {
        operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_770._M_dataplus._M_p != &local_770.field_2) {
        operator_delete(local_770._M_dataplus._M_p,local_770.field_2._M_allocated_capacity + 1);
      }
      if ((char *)local_6f8._0_8_ != pcVar2) {
        operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
      }
      local_6f8._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"BuildName","");
      cmXMLWriter::StartElement((cmXMLWriter *)local_750,(string *)local_6f8);
      cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_750,&local_530);
      cmXMLWriter::EndElement((cmXMLWriter *)local_750);
      if ((char *)local_6f8._0_8_ != pcVar2) {
        operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
      }
      local_6f8._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"BuildStamp","");
      cmCTest::GetCurrentTag_abi_cxx11_(&local_550,(this->super_cmCTestGenericHandler).CTest);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_550);
      local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
      puVar13 = (ulong *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar13) {
        local_770.field_2._M_allocated_capacity = *puVar13;
        local_770.field_2._8_8_ = plVar9[3];
      }
      else {
        local_770.field_2._M_allocated_capacity = *puVar13;
        local_770._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_770._M_string_length = plVar9[1];
      *plVar9 = (long)puVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      cmCTest::GetTestModelString_abi_cxx11_(&local_580,(this->super_cmCTestGenericHandler).CTest);
      uVar15 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_770._M_dataplus._M_p != &local_770.field_2) {
        uVar15 = local_770.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < local_580._M_string_length + local_770._M_string_length) {
        uVar15 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_580._M_dataplus._M_p != &local_580.field_2) {
          uVar15 = local_580.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar15 < local_580._M_string_length + local_770._M_string_length)
        goto LAB_002fdc5a;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_580,0,(char *)0x0,(ulong)local_770._M_dataplus._M_p);
      }
      else {
LAB_002fdc5a:
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_770,(ulong)local_580._M_dataplus._M_p);
      }
      psVar12 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_798.field_2._M_allocated_capacity = *psVar12;
        local_798.field_2._8_8_ = puVar10[3];
        local_798._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_798.field_2._M_allocated_capacity = *psVar12;
        local_798._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_798._M_string_length = puVar10[1];
      *puVar10 = psVar12;
      puVar10[1] = 0;
      *(undefined1 *)psVar12 = 0;
      cmXMLWriter::StartElement((cmXMLWriter *)local_750,(string *)local_6f8);
      cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_750,&local_798);
      cmXMLWriter::EndElement((cmXMLWriter *)local_750);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_798._M_dataplus._M_p != paVar1) {
        operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_580._M_dataplus._M_p != &local_580.field_2) {
        operator_delete(local_580._M_dataplus._M_p,local_580.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_770._M_dataplus._M_p != &local_770.field_2) {
        operator_delete(local_770._M_dataplus._M_p,local_770.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_550._M_dataplus._M_p != &local_550.field_2) {
        operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
      }
      if ((char *)local_6f8._0_8_ != pcVar2) {
        operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
      }
      local_6f8._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"StartDateTime","");
      cmXMLWriter::StartElement((cmXMLWriter *)local_750,(string *)local_6f8);
      cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_750,&local_510);
      cmXMLWriter::EndElement((cmXMLWriter *)local_750);
      if ((char *)local_6f8._0_8_ != pcVar2) {
        operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
      }
      local_6f8._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"StartTime","");
      cmXMLWriter::Element<unsigned_int>((cmXMLWriter *)local_750,(string *)local_6f8,&uStack_6fc);
      if ((char *)local_6f8._0_8_ != pcVar2) {
        operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
      }
      local_6f8._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"UpdateCommand","");
      cmXMLWriter::StartElement((cmXMLWriter *)local_750,(string *)local_6f8);
      content = &(this_00->super_cmCTestGlobalVC).super_cmCTestVC.UpdateCommandLine;
      cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_750,content);
      cmXMLWriter::EndElement((cmXMLWriter *)local_750);
      if ((char *)local_6f8._0_8_ != pcVar2) {
        operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
      }
      local_6f8._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"UpdateType","");
      if ((ulong)(uint)this->UpdateType < 7) {
        local_798._M_dataplus._M_p = cmCTestUpdateHandlerUpdateStrings[(uint)this->UpdateType];
      }
      else {
        local_798._M_dataplus._M_p = "Unknown";
      }
      cmXMLWriter::StartElement((cmXMLWriter *)local_750,(string *)local_6f8);
      cmXMLWriter::Content<char_const*>((cmXMLWriter *)local_750,(char **)&local_798);
      cmXMLWriter::EndElement((cmXMLWriter *)local_750);
      if ((char *)local_6f8._0_8_ != pcVar2) {
        operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
      }
      local_560 = content;
      local_772 = cmCTestVC::WriteXML((cmCTestVC *)this_00,(cmXMLWriter *)local_750);
      iVar16 = (this_00->super_cmCTestGlobalVC).super_cmCTestVC.PathCount[0];
      if (iVar16 != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6f8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6f8,"   Found ",9);
        poVar11 = (ostream *)std::ostream::operator<<(local_6f8,iVar16);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," updated files\n",0xf);
        pcVar4 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                     ,0xd0,local_798._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_798._M_dataplus._M_p != paVar1) {
          operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6f8);
        std::ios_base::~ios_base(local_688);
      }
      iVar14 = (this_00->super_cmCTestGlobalVC).super_cmCTestVC.PathCount[1];
      if (iVar14 == 0) {
        iVar14 = 0;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6f8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6f8,"   Found ",9);
        poVar11 = (ostream *)std::ostream::operator<<(local_6f8,iVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," locally modified files\n",0x18)
        ;
        pcVar4 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                     ,0xd5,local_798._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_798._M_dataplus._M_p != &local_798.field_2) {
          operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6f8);
        std::ios_base::~ios_base(local_688);
      }
      iVar3 = (local_7a0->super_cmCTestGlobalVC).super_cmCTestVC.PathCount[2];
      if (iVar3 != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6f8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6f8,"   Found ",9);
        poVar11 = (ostream *)std::ostream::operator<<(local_6f8,iVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," conflicting files\n",0x13);
        pcVar4 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                     ,0xdb,local_798._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_798._M_dataplus._M_p != &local_798.field_2) {
          operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6f8);
        std::ios_base::~ios_base(local_688);
        iVar14 = iVar14 + iVar3;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6f8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6f8,"End",3);
      std::ios::widen((char)(ostream *)local_6f8 + (char)*(undefined8 *)(local_6f8._0_8_ + -0x18));
      std::ostream::put((char)local_6f8);
      std::ostream::flush();
      pcVar4 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,0,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                   ,0xdf,local_798._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_798._M_dataplus._M_p != &local_798.field_2) {
        operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6f8);
      std::ios_base::~ios_base(local_688);
      cmCTest::CurrentTime_abi_cxx11_(&local_798,(this->super_cmCTestGenericHandler).CTest);
      local_6f8._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"EndDateTime","");
      cmXMLWriter::StartElement((cmXMLWriter *)local_750,(string *)local_6f8);
      cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_750,&local_798);
      cmXMLWriter::EndElement((cmXMLWriter *)local_750);
      if ((char *)local_6f8._0_8_ != pcVar2) {
        operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
      }
      local_6f8._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"EndTime","");
      dVar5 = cmsys::SystemTools::GetTime();
      local_770._M_dataplus._M_p._0_4_ = (int)(long)dVar5;
      cmXMLWriter::Element<unsigned_int>
                ((cmXMLWriter *)local_750,(string *)local_6f8,(uint *)&local_770);
      if ((char *)local_6f8._0_8_ != pcVar2) {
        operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
      }
      local_6f8._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"ElapsedMinutes","");
      dVar5 = cmsys::SystemTools::GetTime();
      local_770._M_dataplus._M_p = (pointer)((double)(int)((dVar5 - local_558) / 6.0) / 10.0);
      cmXMLWriter::Element<double>
                ((cmXMLWriter *)local_750,(string *)local_6f8,(double *)&local_770);
      if ((char *)local_6f8._0_8_ != pcVar2) {
        operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
      }
      local_6f8._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"UpdateReturnStatus","");
      cmXMLWriter::StartElement((cmXMLWriter *)local_750,(string *)local_6f8);
      if ((char *)local_6f8._0_8_ != pcVar2) {
        operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
      }
      cVar6 = local_771;
      this_00 = local_7a0;
      if (iVar14 != 0) {
        cmXMLWriter::Content<char[72]>
                  ((cmXMLWriter *)local_750,
                   (char (*) [72])
                   "Update error: There are modified or conflicting files in the repository");
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6f8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_6f8,
                   "   There are modified or conflicting files in the repository",0x3c);
        std::ios::widen((char)(ostream *)local_6f8 + (char)*(undefined8 *)(local_6f8._0_8_ + -0x18))
        ;
        std::ostream::put((char)local_6f8);
        std::ostream::flush();
        pcVar4 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,6,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                     ,0xee,local_770._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_770._M_dataplus._M_p != &local_770.field_2) {
          operator_delete(local_770._M_dataplus._M_p,local_770.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6f8);
        std::ios_base::~ios_base(local_688);
      }
      if (cVar6 == '\0') {
        cmXMLWriter::Content<char[24]>
                  ((cmXMLWriter *)local_750,(char (*) [24])"Update command failed:\n");
        cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_750,local_560);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6f8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_6f8,"   Update command failed: ",0x1a);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_6f8,
                             (this_00->super_cmCTestGlobalVC).super_cmCTestVC.UpdateCommandLine.
                             _M_dataplus._M_p,
                             (this_00->super_cmCTestGlobalVC).super_cmCTestVC.UpdateCommandLine.
                             _M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
        pcVar4 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                     ,0xf4,local_770._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_770._M_dataplus._M_p != &local_770.field_2) {
          operator_delete(local_770._M_dataplus._M_p,local_770.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6f8);
        std::ios_base::~ios_base(local_688);
      }
      cmXMLWriter::EndElement((cmXMLWriter *)local_750);
      cmXMLWriter::EndElement((cmXMLWriter *)local_750);
      cmXMLWriter::EndDocument((cmXMLWriter *)local_750);
      if (local_772 == '\0') {
        iVar16 = -1;
      }
      if (cVar6 == '\0') {
        iVar16 = -1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_798._M_dataplus._M_p != &local_798.field_2) {
        operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
      }
      cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_750);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_530._M_dataplus._M_p != &local_530.field_2) {
        operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_510._M_dataplus._M_p != &local_510.field_2) {
        operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6f8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_6f8,"Cannot open log file",0x14);
      std::ios::widen((char)(ostream *)local_6f8 + (char)*(undefined8 *)(local_6f8._0_8_ + -0x18));
      std::ostream::put((char)local_6f8);
      std::ostream::flush();
      pcVar4 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,6,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                   ,0xad,(char *)local_750._0_8_,false);
      if ((undefined1 *)local_750._0_8_ != local_750 + 0x10) {
        operator_delete((void *)local_750._0_8_,local_750._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6f8);
      std::ios_base::~ios_base(local_688);
      iVar16 = -1;
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_4f0);
    (*(this_00->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC[1])(this_00);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
LAB_002fe6cd:
  cmCLocaleEnvironmentScope::~cmCLocaleEnvironmentScope(&local_2a8);
  return iVar16;
}

Assistant:

int cmCTestUpdateHandler::ProcessHandler()
{
  // Make sure VCS tool messages are in English so we can parse them.
  cmCLocaleEnvironmentScope fixLocale;
  static_cast<void>(fixLocale);

  // Get source dir
  const char* sourceDirectory = this->GetOption("SourceDirectory");
  if (!sourceDirectory) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find SourceDirectory  key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  cmGeneratedFileStream ofs;
  if (!this->CTest->GetShowOnly()) {
    this->StartLogFile("Update", ofs);
  }

  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     "   Updating the repository: " << sourceDirectory
                                                    << std::endl,
                     this->Quiet);

  if (!this->SelectVCS()) {
    return -1;
  }

  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "   Use "
                       << cmCTestUpdateHandlerUpdateToString(this->UpdateType)
                       << " repository type" << std::endl;
                     , this->Quiet);

  // Create an object to interact with the VCS tool.
  CM_AUTO_PTR<cmCTestVC> vc;
  switch (this->UpdateType) {
    case e_CVS:
      vc.reset(new cmCTestCVS(this->CTest, ofs));
      break;
    case e_SVN:
      vc.reset(new cmCTestSVN(this->CTest, ofs));
      break;
    case e_BZR:
      vc.reset(new cmCTestBZR(this->CTest, ofs));
      break;
    case e_GIT:
      vc.reset(new cmCTestGIT(this->CTest, ofs));
      break;
    case e_HG:
      vc.reset(new cmCTestHG(this->CTest, ofs));
      break;
    case e_P4:
      vc.reset(new cmCTestP4(this->CTest, ofs));
      break;
    default:
      vc.reset(new cmCTestVC(this->CTest, ofs));
      break;
  }
  vc->SetCommandLineTool(this->UpdateCommand);
  vc->SetSourceDirectory(sourceDirectory);

  // Cleanup the working tree.
  vc->Cleanup();

  //
  // Now update repository and remember what files were updated
  //
  cmGeneratedFileStream os;
  if (!this->StartResultingXML(cmCTest::PartUpdate, "Update", os)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Cannot open log file"
                 << std::endl);
    return -1;
  }
  std::string start_time = this->CTest->CurrentTime();
  unsigned int start_time_time =
    static_cast<unsigned int>(cmSystemTools::GetTime());
  double elapsed_time_start = cmSystemTools::GetTime();

  bool updated = vc->Update();
  std::string buildname =
    cmCTest::SafeBuildIdField(this->CTest->GetCTestConfiguration("BuildName"));

  cmXMLWriter xml(os);
  xml.StartDocument();
  xml.StartElement("Update");
  xml.Attribute("mode", "Client");
  xml.Attribute("Generator",
                std::string("ctest-") + cmVersion::GetCMakeVersion());
  xml.Element("Site", this->CTest->GetCTestConfiguration("Site"));
  xml.Element("BuildName", buildname);
  xml.Element("BuildStamp", this->CTest->GetCurrentTag() + "-" +
                this->CTest->GetTestModelString());
  xml.Element("StartDateTime", start_time);
  xml.Element("StartTime", start_time_time);
  xml.Element("UpdateCommand", vc->GetUpdateCommandLine());
  xml.Element("UpdateType",
              cmCTestUpdateHandlerUpdateToString(this->UpdateType));

  bool loadedMods = vc->WriteXML(xml);

  int localModifications = 0;
  int numUpdated = vc->GetPathCount(cmCTestVC::PathUpdated);
  if (numUpdated) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "   Found " << numUpdated << " updated files\n",
                       this->Quiet);
  }
  if (int numModified = vc->GetPathCount(cmCTestVC::PathModified)) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "   Found "
                         << numModified << " locally modified files\n",
                       this->Quiet);
    localModifications += numModified;
  }
  if (int numConflicting = vc->GetPathCount(cmCTestVC::PathConflicting)) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "   Found " << numConflicting << " conflicting files\n",
                       this->Quiet);
    localModifications += numConflicting;
  }

  cmCTestOptionalLog(this->CTest, DEBUG, "End" << std::endl, this->Quiet);
  std::string end_time = this->CTest->CurrentTime();
  xml.Element("EndDateTime", end_time);
  xml.Element("EndTime", static_cast<unsigned int>(cmSystemTools::GetTime()));
  xml.Element(
    "ElapsedMinutes",
    static_cast<int>((cmSystemTools::GetTime() - elapsed_time_start) / 6) /
      10.0);

  xml.StartElement("UpdateReturnStatus");
  if (localModifications) {
    xml.Content("Update error: "
                "There are modified or conflicting files in the repository");
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "   There are modified or conflicting files in the repository"
                 << std::endl);
  }
  if (!updated) {
    xml.Content("Update command failed:\n");
    xml.Content(vc->GetUpdateCommandLine());
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "   Update command failed: "
                 << vc->GetUpdateCommandLine() << "\n");
  }
  xml.EndElement(); // UpdateReturnStatus
  xml.EndElement(); // Update
  xml.EndDocument();
  return updated && loadedMods ? numUpdated : -1;
}